

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memutil.cc
# Opt level: O3

int absl::lts_20250127::strings_internal::memcasecmp(char *s1,char *s2,size_t len)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  size_t sVar4;
  
  if (len != 0) {
    sVar4 = 0;
    do {
      bVar1 = s1[sVar4];
      bVar2 = s2[sVar4];
      if (bVar1 != bVar2) {
        uVar3 = bVar1 + 0x20 & 0xff;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          uVar3 = (uint)bVar1;
        }
        bVar1 = bVar2 + 0x20;
        if (0x19 < (byte)(bVar2 + 0xbf)) {
          bVar1 = bVar2;
        }
        if (uVar3 - bVar1 != 0) {
          return uVar3 - bVar1;
        }
      }
      sVar4 = sVar4 + 1;
    } while (len != sVar4);
  }
  return 0;
}

Assistant:

int memcasecmp(const char* s1, const char* s2, size_t len) {
  const unsigned char* us1 = reinterpret_cast<const unsigned char*>(s1);
  const unsigned char* us2 = reinterpret_cast<const unsigned char*>(s2);

  for (size_t i = 0; i < len; i++) {
    unsigned char c1 = us1[i];
    unsigned char c2 = us2[i];
    // If bytes are the same, they will be the same when converted to lower.
    // So we only need to convert if bytes are not equal.
    // NOTE(b/308193381): We do not use `absl::ascii_tolower` here in order
    // to avoid its lookup table and improve performance.
    if (c1 != c2) {
      c1 = c1 >= 'A' && c1 <= 'Z' ? c1 - 'A' + 'a' : c1;
      c2 = c2 >= 'A' && c2 <= 'Z' ? c2 - 'A' + 'a' : c2;
      const int diff = int{c1} - int{c2};
      if (diff != 0) return diff;
    }
  }
  return 0;
}